

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::operator+(Matrix *__return_storage_ptr__,Matrix *this,Matrix *mat)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  uint i;
  ulong uVar4;
  ulong uVar5;
  
  if (((this->m_shape).field_0.m_dims[0] == (mat->m_shape).field_0.m_dims[0]) &&
     ((this->m_shape).field_0.m_dims[1] == (mat->m_shape).field_0.m_dims[1])) {
    Matrix(__return_storage_ptr__,&this->m_shape);
    for (uVar4 = 0; uVar4 < (this->m_shape).field_0.m_dims[0]; uVar4 = uVar4 + 1) {
      pvVar1 = (this->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (mat->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (__return_storage_ptr__->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar5 = 0; uVar5 < (this->m_shape).field_0.m_dims[1]; uVar5 = uVar5 + 1) {
        *(double *)
         (*(long *)&pvVar3[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl +
         uVar5 * 8) = *(double *)
                       (*(long *)&pvVar1[uVar4].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl + uVar5 * 8) +
                      *(double *)
                       (*(long *)&pvVar2[uVar4].super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl + uVar5 * 8);
      }
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [+ operator]: Shape doesn\'t match!\n");
  exit(1);
}

Assistant:

bool Shape::operator==(const Shape& shape) const{
    return (n_row==shape.n_row && n_col==shape.n_col);
}